

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitExtGNU_AsmOperand(SyntaxDumper *this,ExtGNU_AsmOperandSyntax *node)

{
  ExpressionSyntax *pEVar1;
  SyntaxToken local_108;
  SyntaxToken local_d0;
  SyntaxToken local_98;
  SyntaxToken local_50;
  ExtGNU_AsmOperandSyntax *local_18;
  ExtGNU_AsmOperandSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (ExtGNU_AsmOperandSyntax *)this;
  ExtGNU_AsmOperandSyntax::openBracketToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,local_18);
  SyntaxToken::~SyntaxToken(&local_50);
  pEVar1 = ExtGNU_AsmOperandSyntax::operandName(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pEVar1);
  ExtGNU_AsmOperandSyntax::closeBracketToken(&local_98,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_98,local_18);
  SyntaxToken::~SyntaxToken(&local_98);
  pEVar1 = ExtGNU_AsmOperandSyntax::constraint(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pEVar1);
  ExtGNU_AsmOperandSyntax::openParenthesisToken(&local_d0,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_d0,local_18);
  SyntaxToken::~SyntaxToken(&local_d0);
  pEVar1 = ExtGNU_AsmOperandSyntax::expression(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pEVar1);
  ExtGNU_AsmOperandSyntax::closeParenthesisToken(&local_108,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_108,local_18);
  SyntaxToken::~SyntaxToken(&local_108);
  return Skip;
}

Assistant:

virtual Action visitExtGNU_AsmOperand(const ExtGNU_AsmOperandSyntax* node) override
    {
        terminal(node->openBracketToken(), node);
        nonterminal(node->operandName());
        terminal(node->closeBracketToken(), node);
        nonterminal(node->constraint());
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->expression());
        terminal(node->closeParenthesisToken(), node);
        return Action::Skip;
    }